

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.c
# Opt level: O1

sexp sexp_complex_acos(sexp ctx,sexp z)

{
  sexp psVar1;
  sexp tmp;
  sexp res;
  sexp_gc_var_t __sexp_gc_preserver2;
  sexp_gc_var_t __sexp_gc_preserver1;
  sexp local_58;
  sexp local_50;
  sexp_gc_var_t local_48;
  sexp_gc_var_t local_38;
  
  local_48.var = &local_58;
  local_38.var = &local_50;
  local_50 = (sexp)0x43e;
  local_48.next = &local_38;
  local_58 = (sexp)0x43e;
  local_38.next = (ctx->value).context.saves;
  (ctx->value).context.saves = local_48.next;
  (ctx->value).context.saves = &local_48;
  local_50 = sexp_complex_asin(ctx,z);
  local_58 = sexp_make_complex(ctx,(sexp)&DAT_00000001,(sexp)&DAT_00000001);
  psVar1 = sexp_make_flonum(ctx,1.5707963267948966);
  (local_58->value).type.name = psVar1;
  psVar1 = sexp_sub(ctx,local_58,local_50);
  (ctx->value).context.saves = local_38.next;
  return psVar1;
}

Assistant:

sexp sexp_complex_acos (sexp ctx, sexp z) {
  sexp_gc_var2(res, tmp);
  sexp_gc_preserve2(ctx, res, tmp);
  res = sexp_complex_asin(ctx, z);
  tmp = sexp_make_complex(ctx, SEXP_ZERO, SEXP_ZERO);
  sexp_complex_real(tmp) = sexp_make_flonum(ctx, acos(-1)/2);
  res = sexp_sub(ctx, tmp, res);
  sexp_gc_release2(ctx);
  return res;
}